

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t wVar1;
  long lVar2;
  int iVar3;
  wchar_t *pwVar4;
  loc_conflict lVar5;
  wchar_t wVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  wchar_t wVar10;
  uint local_9c;
  wchar_t ac;
  wchar_t vc;
  wchar_t *local_90;
  wchar_t *local_88;
  wchar_t local_7c;
  wchar_t *local_78;
  ulong local_70;
  wchar_t *local_68;
  long local_60;
  ulong local_58;
  ui_entry_combiner_funcs_conflict combiner;
  
  lVar5.y = 0;
  lVar5.x = (details->value_position).x;
  uVar9 = (ulong)(uint)(details->value_position).y;
  local_9c = 7;
  if (details->alternate_color_first == false) {
    local_9c = 0;
  }
  local_60 = ((long)info->ndigit + 1) - (ulong)(info->sign == L'\0');
  local_90 = label;
  local_88 = auxvals;
  local_7c = nlabel;
  local_78 = vals;
  pwVar4 = (wchar_t *)mem_alloc(local_60 * 4);
  lVar2 = local_60;
  if (((info->ncolors < L'\x0e') || (info->nlabcolors < L'\x06')) || (info->nsym < L'\a')) {
    __assert_fail("info->ncolors >= 14 && info->nlabcolors >= 6 && info->nsym >= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                  ,0x3ec,
                  "void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                 );
  }
  if (L'\0' < n) {
    local_70 = (ulong)(uint)n;
    uVar7 = 0;
    local_68 = pwVar4;
    do {
      pwVar4 = local_68;
      wVar6 = local_78[uVar7];
      wVar10 = (wchar_t)lVar2;
      local_58 = uVar7;
      if (wVar6 == L'\x7fffffff') {
LAB_001c1894:
        wVar6 = *info->symbols;
        wVar1 = info->sign;
        iVar3 = 0;
LAB_001c18da:
        format_int(L'\0',false,wVar6,wVar6,true,wVar1 == L'\x01',wVar10,local_68);
      }
      else {
        if (wVar6 == L'\x7ffffffe') {
          wVar6 = info->symbols[1];
          wVar1 = info->sign;
          iVar3 = 1;
          goto LAB_001c18da;
        }
        if ((wVar6 == L'\0') && (local_88[uVar7] == L'\x7fffffff')) goto LAB_001c1894;
        if (wVar6 < L'\x01') {
          if (wVar6 < L'\0') {
            format_int(-wVar6,false,info->symbols[2],info->symbols[4],false,info->sign != L'\0',
                       wVar10,local_68);
            iVar3 = 4;
          }
          else {
            wVar1 = local_88[uVar7];
            if ((uint)(wVar1 + L'\x80000002') < 0x80000003) {
              if (wVar1 < L'\0') {
                format_int(-wVar6,false,info->symbols[2],info->symbols[6],false,info->sign != L'\0',
                           wVar10,local_68);
                iVar3 = 6;
              }
              else {
                format_int(L'\0',false,info->symbols[2],info->symbols[3],true,info->sign == L'\x01',
                           wVar10,local_68);
                iVar3 = 2;
              }
            }
            else {
              format_int(wVar1,false,info->symbols[2],info->symbols[5],true,info->sign == L'\x01',
                         wVar10,local_68);
              iVar3 = 5;
            }
          }
        }
        else {
          format_int(wVar6,false,info->symbols[2],info->symbols[3],true,info->sign == L'\x01',wVar10
                     ,local_68);
          iVar3 = 3;
        }
      }
      safe_queue_chars(lVar5.x,(wchar_t)uVar9,wVar10,info->colors[iVar3 + local_9c],pwVar4);
      if (info->units_nlabel != L'\0') {
        safe_queue_chars(wVar10 + lVar5.x,(wchar_t)uVar9,info->units_nlabel,
                         info->colors[iVar3 + local_9c],info->units_label);
      }
      lVar5 = loc_sum((loc_conflict)((ulong)lVar5 & 0xffffffff | uVar9 << 0x20),
                      (loc_conflict)details->position_step);
      uVar9 = (ulong)lVar5 >> 0x20;
      local_9c = local_9c ^ 7;
      uVar7 = local_58 + 1;
      pwVar4 = local_68;
    } while (local_70 != uVar7);
  }
  mem_free(pwVar4);
  wVar6 = local_7c;
  if ((L'\0' < local_7c) || (details->show_combined == true)) {
    iVar3 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&combiner);
    if (iVar3 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                    ,0x445,
                    "void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                   );
    }
    (*combiner.vec_func)(n,local_78,local_88,&vc,&ac);
    pwVar4 = local_90;
    if (L'\0' < wVar6) {
      if (details->known_rune == true) {
        if (((uint)(vc + L'\x80000002') < 2) || (vc == L'\0')) {
          uVar9 = 1;
          if ((1 < (uint)(ac + L'\x80000002')) && (ac != L'\0')) {
            uVar9 = (ulong)(L'\0' < ac) ^ 5;
          }
        }
        else {
          uVar9 = (ulong)(L'\0' < vc) ^ 3;
        }
      }
      else {
        uVar9 = 0;
      }
      wVar10 = (details->label_position).x;
      wVar1 = (details->label_position).y;
      if (details->vertical_label == true) {
        uVar7 = 1;
        if (L'\x01' < wVar6) {
          uVar7 = (ulong)(uint)wVar6;
        }
        uVar8 = 0;
        do {
          Term_putch(wVar10,wVar1 + (int)uVar8,info->label_colors[uVar9],pwVar4[uVar8]);
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      else {
        safe_queue_chars(wVar10,wVar1,wVar6,info->label_colors[uVar9],local_90);
      }
    }
    if (details->show_combined == true) {
      show_combined_generic(info,details,vc,ac);
    }
  }
  return;
}

Assistant:

static void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	int nbuf = info->ndigit + ((info->sign == UI_ENTRY_NO_SIGN) ? 0 : 1);
	wchar_t *buffer = mem_alloc(nbuf * sizeof(*buffer));
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 14 && info->nlabcolors >= 6 && info->nsym >= 7);

	for (i = 0; i < n; ++i) {
		int palette_index;

		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE || (vals[i] == 0 &&
			auxvals[i] == UI_ENTRY_UNKNOWN_VALUE)) {
			palette_index = 0;
			format_int(0, false, info->symbols[0],
				info->symbols[0], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN, nbuf,
				buffer);
		} else if (vals[i] == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
			format_int(0, false, info->symbols[1],
				info->symbols[1], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN, nbuf,
				buffer);
		} else if (vals[i] > 0) {
			palette_index = 3;
			format_int(vals[i], false, info->symbols[2],
				info->symbols[3], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN,
				nbuf, buffer);
		} else if (vals[i] < 0) {
			int v;
			bool o;

			palette_index = 4;
			if (vals[i] == INT_MIN) {
				v = -(INT_MIN + 1);
				o = true;
			} else {
				v = -vals[i];
				o = false;
			}
			format_int(v, o, info->symbols[2], info->symbols[4],
				false, info->sign != UI_ENTRY_NO_SIGN, nbuf,
				buffer);
		} else if (auxvals[i] > 0 &&
			auxvals[i] != UI_ENTRY_UNKNOWN_VALUE &&
			auxvals[i] != UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 5;
			format_int(auxvals[i], false, info->symbols[2],
				info->symbols[5], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN, nbuf,
				buffer);
		} else if (auxvals[i] < 0 &&
			auxvals[i] != UI_ENTRY_UNKNOWN_VALUE &&
			auxvals[i] != UI_ENTRY_VALUE_NOT_PRESENT) {
			int v;
			bool o;

			palette_index = 6;
			if (auxvals[i] == INT_MIN) {
				v = -(INT_MIN + 1);
				o = true;
			} else {
				v = -vals[i];
				o = false;
			}
			format_int(v, o, info->symbols[2], info->symbols[6],
				false, info->sign != UI_ENTRY_NO_SIGN, nbuf,
				buffer);
		} else {
			palette_index = 2;
			format_int(0, false, info->symbols[2],
				info->symbols[3], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN,
				nbuf, buffer);
		}
		safe_queue_chars(p.x, p.y, nbuf,
			info->colors[palette_index + color_offset], buffer);
		if (info->units_nlabel != 0) {
			safe_queue_chars(p.x + nbuf, p.y, info->units_nlabel,
				info->colors[palette_index + color_offset],
				info->units_label);
		}
		p = loc_sum(p, details->position_step);
		color_offset ^= 7;
	}

	mem_free(buffer);

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index;

		if (! details->known_rune) {
			palette_index = 0;
		} else if (vc == 0 || vc == UI_ENTRY_UNKNOWN_VALUE ||
			vc == UI_ENTRY_VALUE_NOT_PRESENT) {
			if (ac == 0 || ac == UI_ENTRY_UNKNOWN_VALUE ||
				ac == UI_ENTRY_VALUE_NOT_PRESENT) {
				palette_index = 1;
			} else if (ac > 0) {
				palette_index = 4;
			} else {
				palette_index = 5;
			}
		} else if (vc > 0) {
			palette_index = 2;
		} else {
			palette_index = 3;
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}